

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

amrex_parser * amrex::parser_dup(amrex_parser *source)

{
  size_t __size;
  amrex_parser *my_parser;
  void *pvVar1;
  parser_node *ppVar2;
  
  my_parser = (amrex_parser *)malloc(0x20);
  __size = source->sz_mempool;
  my_parser->sz_mempool = __size;
  pvVar1 = malloc(__size);
  my_parser->p_root = pvVar1;
  my_parser->p_free = pvVar1;
  ppVar2 = parser_ast_dup(my_parser,source->ast,0);
  my_parser->ast = ppVar2;
  return my_parser;
}

Assistant:

struct amrex_parser*
parser_dup (struct amrex_parser* source)
{
    struct amrex_parser* dest = (struct amrex_parser*) std::malloc(sizeof(struct amrex_parser));
    dest->sz_mempool = source->sz_mempool;
    dest->p_root = std::malloc(dest->sz_mempool);
    dest->p_free = dest->p_root;

    dest->ast = parser_ast_dup(dest, source->ast, 0); /* 0: don't free the source */

    return dest;
}